

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
ipx::Model::MultiplyWithScaledMatrix(Model *this,Vector *rhs,double alpha,Vector *lhs,char trans)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  if ((trans & 0xdfU) == 0x54) {
    if (this->dualized_ == false) {
      iVar1 = this->num_var_;
      if (0 < (long)iVar1) {
        piVar5 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = rhs->_M_data;
        pdVar7 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = lhs->_M_data;
        lVar9 = 0;
        do {
          iVar2 = piVar5[lVar9];
          lVar10 = (long)iVar2;
          iVar3 = piVar5[lVar9 + 1];
          dVar11 = 0.0;
          if (iVar2 < iVar3) {
            do {
              dVar11 = dVar11 + pdVar4[piVar6[lVar10]] * pdVar7[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar3 != lVar10);
          }
          pdVar8[lVar9] = dVar11 * alpha + pdVar8[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar1);
      }
    }
    else {
      iVar1 = this->num_constr_;
      if (0 < (long)iVar1) {
        pdVar4 = rhs->_M_data;
        piVar5 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = lhs->_M_data;
        lVar9 = 0;
        do {
          iVar2 = piVar5[lVar9];
          lVar10 = (long)iVar2;
          iVar3 = piVar5[lVar9 + 1];
          if (iVar2 < iVar3) {
            dVar11 = pdVar4[lVar9];
            do {
              iVar2 = piVar6[lVar10];
              pdVar8[iVar2] = pdVar7[lVar10] * dVar11 * alpha + pdVar8[iVar2];
              lVar10 = lVar10 + 1;
            } while (iVar3 != lVar10);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != iVar1);
      }
    }
  }
  else if (this->dualized_ == false) {
    iVar1 = this->num_var_;
    if (0 < (long)iVar1) {
      pdVar4 = rhs->_M_data;
      piVar5 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = lhs->_M_data;
      lVar9 = 0;
      do {
        iVar2 = piVar5[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar5[lVar9 + 1];
        if (iVar2 < iVar3) {
          dVar11 = pdVar4[lVar9];
          do {
            iVar2 = piVar6[lVar10];
            pdVar8[iVar2] = pdVar7[lVar10] * dVar11 * alpha + pdVar8[iVar2];
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  else {
    iVar1 = this->num_constr_;
    if (0 < (long)iVar1) {
      piVar5 = (this->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = rhs->_M_data;
      pdVar7 = (this->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = lhs->_M_data;
      lVar9 = 0;
      do {
        iVar2 = piVar5[lVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar5[lVar9 + 1];
        dVar11 = 0.0;
        if (iVar2 < iVar3) {
          do {
            dVar11 = dVar11 + pdVar4[piVar6[lVar10]] * pdVar7[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        pdVar8[lVar9] = dVar11 * alpha + pdVar8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != iVar1);
    }
  }
  return;
}

Assistant:

void Model::MultiplyWithScaledMatrix(const Vector& rhs, double alpha,
                                     Vector& lhs, char trans) const {
    if (trans == 't' || trans == 'T') {
        assert((Int)rhs.size() == num_constr_);
        assert((Int)lhs.size() == num_var_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                ScatterColumn(AI_, i, alpha*rhs[i], lhs);
        else
            for (Int j = 0; j < num_var_; j++)
                lhs[j] += alpha * DotColumn(AI_, j, rhs);
    }
    else {
        assert((Int)rhs.size() == num_var_);
        assert((Int)lhs.size() == num_constr_);
        if (dualized())
            for (Int i = 0; i < num_constr_; i++)
                lhs[i] += alpha * DotColumn(AI_, i, rhs);
        else
            for (Int j = 0; j < num_var_; j++)
                ScatterColumn(AI_, j, alpha*rhs[j], lhs);
    }
}